

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O3

void al_register_event_source(ALLEGRO_EVENT_QUEUE *queue,ALLEGRO_EVENT_SOURCE *source)

{
  _Bool _Var1;
  undefined8 *puVar2;
  ALLEGRO_EVENT_SOURCE *local_10;
  
  local_10 = source;
  _Var1 = _al_vector_contains(&queue->sources,&local_10);
  if (!_Var1) {
    _al_event_source_on_registration_to_queue(local_10,queue);
    if ((queue->mutex).inited == true) {
      pthread_mutex_lock((pthread_mutex_t *)&(queue->mutex).mutex);
    }
    puVar2 = (undefined8 *)_al_vector_alloc_back(&queue->sources);
    *puVar2 = local_10;
    if ((queue->mutex).inited == true) {
      pthread_mutex_unlock((pthread_mutex_t *)&(queue->mutex).mutex);
    }
  }
  return;
}

Assistant:

void al_register_event_source(ALLEGRO_EVENT_QUEUE *queue,
   ALLEGRO_EVENT_SOURCE *source)
{
   ALLEGRO_EVENT_SOURCE **slot;
   ASSERT(queue);
   ASSERT(source);

   if (!_al_vector_contains(&queue->sources, &source)) {
      _al_event_source_on_registration_to_queue(source, queue);
      _al_mutex_lock(&queue->mutex);
      slot = _al_vector_alloc_back(&queue->sources);
      *slot = source;
      _al_mutex_unlock(&queue->mutex);
   }
}